

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O2

uint dmrC_value_size(longlong value)

{
  uint uVar1;
  
  if ((ulong)value < 0x100) {
    uVar1 = 8;
  }
  else if ((ulong)value < 0x10000) {
    uVar1 = 0x10;
  }
  else {
    uVar1 = (uint)((ulong)value >> 0x20 != 0) * 0x20 + 0x20;
  }
  return uVar1;
}

Assistant:

unsigned int dmrC_value_size(long long value)
{
	value >>= 8;
	if (!value)
		return 8;
	value >>= 8;
	if (!value)
		return 16;
	value >>= 16;
	if (!value)
		return 32;
	return 64;
}